

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_semantic_analysis.cpp
# Opt level: O1

compile_errcode __thiscall
ArgumentList::Action
          (ArgumentList *this,vector<_SymbolType,_std::allocator<_SymbolType>_> *argument_type)

{
  int line_number;
  int character_number;
  pointer pSVar1;
  LogTools *this_00;
  bool bVar2;
  SymbolName SVar3;
  SymbolName *pSVar4;
  iterator __position;
  undefined4 uVar5;
  string *name;
  SymbolName *pSVar6;
  SymbolTableTerm term;
  SymbolKind local_84;
  string *local_80;
  ArgumentList *local_78;
  SymbolName *local_70;
  SymbolTableTerm local_68;
  
  local_80 = &this->m_identifier_name;
  pSVar4 = &this->m_type;
  uVar5 = 0;
  local_78 = this;
  local_70 = pSVar4;
  do {
    pSVar6 = (SymbolName *)((ulong)pSVar4 & 0xffffffff);
    SVar3 = SymbolQueue::GetCurrentName(handle_correct_queue);
    switch(uVar5) {
    case 0:
      uVar5 = 0;
      pSVar4 = (SymbolName *)0x0;
      bVar2 = false;
      if (SVar3 != R_CIRCLE_BRACKET_SYM) {
        if ((SVar3 & ~SWITCH_SYM) != INT_SYM) {
          pSVar4 = (SymbolName *)0xffffffff;
          uVar5 = 0;
          goto LAB_00133f5b;
        }
        if (SVar3 == CHAR_SYM) goto LAB_00133f03;
        if (SVar3 == INT_SYM) goto LAB_00133da7;
        Action();
        goto LAB_00133f32;
      }
      goto LAB_00133f5d;
    case 1:
      if (SVar3 != IDENTIFIER_SYM) {
        pSVar4 = (SymbolName *)0xffffffff;
        uVar5 = 1;
LAB_00133f5b:
        bVar2 = false;
        goto LAB_00133f5d;
      }
      pSVar1 = (handle_correct_queue->m_symbol_queue).
               super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.super__Vector_impl_data.
               _M_start;
      line_number = pSVar1[handle_correct_queue->m_current_locate].m_line_number;
      character_number = pSVar1[handle_correct_queue->m_current_locate].m_character_number;
      c0_compile::SymbolValue::GetValue<std::__cxx11::string>
                (&local_68.m_name,
                 &(handle_correct_queue->m_symbol_queue).
                  super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
                  super__Vector_impl_data._M_start[handle_correct_queue->m_current_locate].m_value);
      name = local_80;
      std::__cxx11::string::operator=((string *)local_80,(string *)&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68.m_name._M_dataplus._M_p != &local_68.m_name.field_2) {
        operator_delete(local_68.m_name._M_dataplus._M_p);
      }
      bVar2 = SymbolTableTree::FindTerm(symbol_table_tree,name,true);
      this_00 = g_log_tools;
      if (bVar2) {
        local_68.m_name._M_dataplus._M_p = (pointer)&local_68.m_name.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,"repeat definition identifier(para)","");
        name = local_80;
        LogTools::SemanticErrorLogs(this_00,&local_68.m_name,local_80,line_number,character_number);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68.m_name._M_dataplus._M_p != &local_68.m_name.field_2) {
          operator_delete(local_68.m_name._M_dataplus._M_p);
        }
      }
      local_84 = PARAMETER;
      SymbolTableTerm::SymbolTableTerm(&local_68,name,&local_84,local_70);
      SymbolTableTree::Insert(symbol_table_tree,&local_68);
      SymbolTableTerm::~SymbolTableTerm(&local_68);
      uVar5 = 2;
      break;
    case 2:
      uVar5 = 3;
      if (SVar3 != COMMA_SYM) {
        pSVar4 = (SymbolName *)0x0;
        uVar5 = 2;
        goto LAB_00133f5b;
      }
      break;
    case 3:
      if ((SVar3 & ~SWITCH_SYM) != INT_SYM) {
        pSVar4 = (SymbolName *)0xffffffff;
        uVar5 = 3;
        goto LAB_00133f5b;
      }
      if (SVar3 == CHAR_SYM) {
LAB_00133f03:
        local_68.m_name._M_dataplus._M_p._0_4_ = 1;
        __position._M_current =
             (argument_type->super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (argument_type->super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
LAB_00133f2a:
          std::vector<_SymbolType,_std::allocator<_SymbolType>_>::_M_realloc_insert<_SymbolType>
                    (argument_type,__position,(_SymbolType *)&local_68);
          goto LAB_00133f32;
        }
        *__position._M_current = CHAR;
      }
      else {
        if (SVar3 != INT_SYM) {
          Action();
          goto LAB_00133f32;
        }
LAB_00133da7:
        local_68.m_name._M_dataplus._M_p =
             (pointer)((ulong)local_68.m_name._M_dataplus._M_p._4_4_ << 0x20);
        __position._M_current =
             (argument_type->super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (argument_type->super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) goto LAB_00133f2a;
        *__position._M_current = INT;
      }
      (argument_type->super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>)._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
LAB_00133f32:
      local_78->m_type = SVar3;
      uVar5 = 1;
    }
    SymbolQueue::NextSymbol(handle_correct_queue);
    bVar2 = true;
    pSVar4 = pSVar6;
LAB_00133f5d:
    if (!bVar2) {
      return (compile_errcode)pSVar4;
    }
  } while( true );
}

Assistant:

compile_errcode ArgumentList::Action(vector<SymbolType>& argument_type) {
    int ret = COMPILE_OK;
    int state = 0;
    while (true) {
        SymbolName name = handle_correct_queue->GetCurrentName();
        int line_number = handle_correct_queue->GetCurrentLine();
        int character_number = handle_correct_queue->GetCurrentCharacter();
        switch (state) {
            case 0: {
                if (name == R_CIRCLE_BRACKET_SYM) {
                    return COMPILE_OK;
                } else if (IsValidVariableType(name)) {
                    if (name == INT_SYM) {
                        argument_type.push_back(INT);
                    } else if (name == CHAR_SYM) {
                        argument_type.push_back(CHAR);
                    } else {
                        fprintf(stderr, "invalid function argument type\n");
                    }
                    state = 1;
                    m_type = name;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 1: {
                if (name == IDENTIFIER_SYM) {
                    m_identifier_name = handle_correct_queue->GetCurrentValue<string>();
                    if (symbol_table_tree->FindTerm(m_identifier_name, true)) {
                        g_log_tools->SemanticErrorLogs(string("repeat definition identifier(para)"), m_identifier_name, line_number, character_number);
                    }
                    SymbolTableTerm term(m_identifier_name, PARAMETER, m_type);
                    symbol_table_tree->Insert(term);
                    state = 2;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 2: {
                if (name == COMMA_SYM) {
                    state = 3;
                    break;
                } else {
                    return COMPILE_OK;
                }
            }
            case 3: {
                if (IsValidVariableType(name)) {
                    if (name == INT_SYM) {
                        argument_type.push_back(INT);
                    } else if (name == CHAR_SYM) {
                        argument_type.push_back(CHAR);
                    } else {
                        fprintf(stderr, "invalid function argument type\n");
                    }
                    state = 1;
                    m_type = name;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
        }
        handle_correct_queue->NextSymbol();
    }
}